

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restraint.hpp
# Opt level: O2

void __thiscall OpenMD::Restraint::~Restraint(Restraint *this)

{
  this->_vptr_Restraint = (_func_int **)&PTR__Restraint_002bbaa8;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::~_Rb_tree(&(this->restInfo_)._M_t);
  std::__cxx11::string::~string((string *)&this->restName_);
  return;
}

Assistant:

virtual ~Restraint() {}